

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLproxycode
socks_state_recv(Curl_cfilter *cf,socks_state *sx,Curl_easy *data,CURLproxycode failcode,
                char *description)

{
  ssize_t sVar1;
  Curl_easy *data_00;
  char *pcVar2;
  CURLcode local_44;
  ssize_t sStack_40;
  CURLcode result;
  ssize_t nread;
  char *description_local;
  Curl_easy *pCStack_28;
  CURLproxycode failcode_local;
  Curl_easy *data_local;
  socks_state *sx_local;
  Curl_cfilter *cf_local;
  
  nread = (ssize_t)description;
  description_local._4_4_ = failcode;
  pCStack_28 = data;
  data_local = (Curl_easy *)sx;
  sx_local = (socks_state *)cf;
  sStack_40 = Curl_conn_cf_recv(cf->next,data,(char *)sx->outp,sx->outstanding,&local_44);
  data_00 = pCStack_28;
  sVar1 = nread;
  if (sStack_40 < 1) {
    if (local_44 == CURLE_AGAIN) {
      cf_local._4_4_ = CURLPX_OK;
    }
    else if (local_44 == CURLE_OK) {
      Curl_failf(pCStack_28,"connection to proxy closed");
      cf_local._4_4_ = CURLPX_CLOSED;
    }
    else {
      pcVar2 = curl_easy_strerror(local_44);
      Curl_failf(data_00,"SOCKS: Failed receiving %s: %s",sVar1,pcVar2);
      cf_local._4_4_ = description_local._4_4_;
    }
  }
  else {
    data_local->id = data_local->id - sStack_40;
    (data_local->set).prereq_userp = (void *)(sStack_40 + (long)(data_local->set).prereq_userp);
    cf_local._4_4_ = CURLPX_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLproxycode socks_state_recv(struct Curl_cfilter *cf,
                                      struct socks_state *sx,
                                      struct Curl_easy *data,
                                      CURLproxycode failcode,
                                      const char *description)
{
  ssize_t nread;
  CURLcode result;

  nread = Curl_conn_cf_recv(cf->next, data, (char *)sx->outp,
                            sx->outstanding, &result);
  if(nread <= 0) {
    if(CURLE_AGAIN == result) {
      return CURLPX_OK;
    }
    else if(CURLE_OK == result) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    failf(data, "SOCKS: Failed receiving %s: %s", description,
          curl_easy_strerror(result));
    return failcode;
  }
  /* remain in reading state */
  DEBUGASSERT(sx->outstanding >= nread);
  sx->outstanding -= nread;
  sx->outp += nread;
  return CURLPX_OK;
}